

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.h
# Opt level: O3

void __thiscall
COLLADASaxFWL::DocumentProcessor::addInstanceJoint
          (DocumentProcessor *this,KinematicInstance *instanceJoint)

{
  pointer *pppKVar1;
  KinematicsIntermediateData *pKVar2;
  iterator __position;
  KinematicInstance *local_8;
  
  pKVar2 = this->mKinematicsIntermediateData;
  __position._M_current =
       (pKVar2->mInstanceJoints).
       super__Vector_base<COLLADASaxFWL::KinematicInstance_*,_std::allocator<COLLADASaxFWL::KinematicInstance_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pKVar2->mInstanceJoints).
      super__Vector_base<COLLADASaxFWL::KinematicInstance_*,_std::allocator<COLLADASaxFWL::KinematicInstance_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = instanceJoint;
    std::vector<COLLADASaxFWL::KinematicInstance*,std::allocator<COLLADASaxFWL::KinematicInstance*>>
    ::_M_realloc_insert<COLLADASaxFWL::KinematicInstance*const&>
              ((vector<COLLADASaxFWL::KinematicInstance*,std::allocator<COLLADASaxFWL::KinematicInstance*>>
                *)&pKVar2->mInstanceJoints,__position,&local_8);
  }
  else {
    *__position._M_current = instanceJoint;
    pppKVar1 = &(pKVar2->mInstanceJoints).
                super__Vector_base<COLLADASaxFWL::KinematicInstance_*,_std::allocator<COLLADASaxFWL::KinematicInstance_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppKVar1 = *pppKVar1 + 1;
  }
  return;
}

Assistant:

void addInstanceJoint( KinematicInstance* instanceJoint ) { mKinematicsIntermediateData.getInstanceJoints().push_back(instanceJoint); }